

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  uint8 uVar1;
  uint8 *puVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  uint32 tag;
  undefined4 extraout_var;
  FieldDescriptor *field;
  byte unaff_BPL;
  uint32 tag_00;
  uint32 length;
  StringOutputStream output_stream;
  string message_data;
  string temp;
  CodedOutputStream coded_output;
  uint32 local_dc;
  StringOutputStream local_d8;
  Message *local_c8;
  string local_c0;
  undefined1 local_a0 [16];
  ArrayInputStream AStack_90;
  undefined8 uStack_70;
  int local_68;
  int local_64;
  DescriptorPool *local_60;
  MessageFactory *pMStack_58;
  ArrayInputStream local_50;
  
  local_c8 = message;
  iVar6 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  tag_00 = 0;
  field = (FieldDescriptor *)0x0;
  do {
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (tag = (uint32)(char)*puVar2, -1 < (int)tag)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar2 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if ((int)tag < 0x10) {
      if (tag == 0) {
LAB_0022bb7c:
        unaff_BPL = 0;
      }
      else {
        if (tag != 0xc) {
LAB_0022bb68:
          bVar5 = SkipField(input,tag,(UnknownFieldSet *)0x0);
LAB_0022bb74:
          if (bVar5 == false) goto LAB_0022bb7c;
LAB_0022bd91:
          bVar5 = true;
          goto LAB_0022bd93;
        }
        unaff_BPL = 1;
      }
      bVar5 = false;
    }
    else if (tag == 0x10) {
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
        input->buffer_ = puVar2 + 1;
        local_d8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream._0_4_ = (int)(char)uVar1;
LAB_0022bbb6:
        iVar4 = (int)local_d8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream;
        field = (FieldDescriptor *)
                (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x218))
                          ((long *)CONCAT44(extraout_var,iVar6),
                           (int)local_d8.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream);
        tag_00 = iVar4 * 8 + 2;
        if (local_c0._M_string_length == 0) {
          bVar5 = true;
        }
        else {
          io::ArrayInputStream::ArrayInputStream
                    (&local_50,local_c0._M_dataplus._M_p,(int)local_c0._M_string_length,-1);
          AStack_90.data_._0_6_ = 0;
          AStack_90._14_8_ = 0;
          local_a0._8_8_ = (uint8 *)0x0;
          AStack_90.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._0_1_ = '\0';
          AStack_90.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._1_5_ = 0;
          AStack_90.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._6_2_ = 0;
          AStack_90.position_ = 0x7fffffff;
          AStack_90.last_returned_size_ = 0;
          uStack_70._0_4_ = 0x4000000;
          uStack_70._4_4_ = 0x2000000;
          local_68 = 0;
          local_64 = io::CodedInputStream::default_recursion_limit_;
          local_60 = (DescriptorPool *)0x0;
          pMStack_58 = (MessageFactory *)0x0;
          local_a0._0_8_ = &local_50;
          io::CodedInputStream::Refresh((CodedInputStream *)local_a0);
          bVar5 = ParseAndMergeField(tag_00,field,local_c8,(CodedInputStream *)local_a0);
          if (bVar5) {
            local_c0._M_string_length = 0;
            *local_c0._M_dataplus._M_p = '\0';
          }
          else {
            unaff_BPL = 0;
          }
          io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_a0);
          io::ArrayInputStream::~ArrayInputStream(&local_50);
        }
      }
      else {
        bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,(uint32 *)&local_d8);
        if (bVar5) goto LAB_0022bbb6;
        unaff_BPL = 0;
        bVar5 = false;
      }
      if (bVar5 != false) goto LAB_0022bd91;
      bVar5 = false;
    }
    else {
      if (tag != 0x1a) goto LAB_0022bb68;
      if (tag_00 != 0) {
        bVar5 = ParseAndMergeField(tag_00,field,local_c8,input);
        goto LAB_0022bb74;
      }
      local_a0._0_8_ = &AStack_90;
      local_a0._8_8_ = (uint8 *)0x0;
      AStack_90.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._0_1_ = '\0';
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
        input->buffer_ = puVar2 + 1;
        local_dc = (int)(char)uVar1;
LAB_0022bcf8:
        bVar5 = io::CodedInputStream::ReadString(input,(string *)local_a0,local_dc);
        if (!bVar5) goto LAB_0022bd60;
        io::StringOutputStream::StringOutputStream(&local_d8,&local_c0);
        io::CodedOutputStream::CodedOutputStream
                  ((CodedOutputStream *)&local_50,&local_d8.super_ZeroCopyOutputStream);
        io::CodedOutputStream::WriteVarint32((CodedOutputStream *)&local_50,local_dc);
        io::CodedOutputStream::WriteRaw
                  ((CodedOutputStream *)&local_50,(void *)local_a0._0_8_,local_a0._8_4_);
        io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&local_50);
        io::StringOutputStream::~StringOutputStream(&local_d8);
        bVar3 = true;
      }
      else {
        bVar5 = io::CodedInputStream::ReadVarint32Fallback(input,&local_dc);
        if (bVar5) goto LAB_0022bcf8;
LAB_0022bd60:
        unaff_BPL = 0;
        bVar3 = false;
      }
      if ((ArrayInputStream *)local_a0._0_8_ != &AStack_90) {
        operator_delete((void *)local_a0._0_8_,
                        CONCAT26(AStack_90.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream._6_2_
                                 ,CONCAT51(AStack_90.super_ZeroCopyInputStream.
                                           _vptr_ZeroCopyInputStream._1_5_,
                                           AStack_90.super_ZeroCopyInputStream.
                                           _vptr_ZeroCopyInputStream._0_1_)) + 1);
      }
      tag_00 = 0;
      bVar5 = false;
      if (bVar3) goto LAB_0022bd91;
    }
LAB_0022bd93:
    if (!bVar5) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(
    io::CodedInputStream* input,
    Message* message) {
  const Reflection* message_reflection = message->GetReflection();

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  // Once we see a type_id, we'll construct a fake tag for this extension
  // which is the tag it would have had under the proto2 extensions wire
  // format.
  uint32 fake_tag = 0;

  // Once we see a type_id, we'll look up the FieldDescriptor for the
  // extension.
  const FieldDescriptor* field = NULL;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        fake_tag = WireFormatLite::MakeTag(
            type_id, WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
        field = message_reflection->FindKnownExtensionByNumber(type_id);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::ArrayInputStream raw_input(message_data.data(),
                                         message_data.size());
          io::CodedInputStream sub_input(&raw_input);
          if (!ParseAndMergeField(fake_tag, field, message,
                                  &sub_input)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (fake_tag == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseAndMergeField(fake_tag, field, message, input)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!SkipField(input, tag, NULL)) return false;
      }
    }
  }
}